

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O2

void ihevcd_unmark_pps(codec_t *ps_codec,WORD32 sps_id)

{
  pps_t *ppVar1;
  long lVar2;
  
  ppVar1 = ps_codec->ps_pps_base;
  for (lVar2 = 0x4b; (int)lVar2 != 0x144b; lVar2 = lVar2 + 0x50) {
    if ((ppVar1->au1_scaling_list_dc_coef[lVar2 + -0x36] != '\0') &&
       ((char)ppVar1->au1_scaling_list_dc_coef[lVar2 + -0x70] == sps_id)) {
      ppVar1->au1_scaling_list_dc_coef[lVar2 + -0x36] = '\0';
    }
  }
  return;
}

Assistant:

void ihevcd_unmark_pps(codec_t *ps_codec, WORD32 sps_id)
{
    WORD32 pps_id = 0;
    pps_t *ps_pps = ps_codec->ps_pps_base;

    for(pps_id = 0; pps_id < MAX_PPS_CNT - 1; pps_id++, ps_pps++)
    {
        if((ps_pps->i1_pps_valid) &&
                        (ps_pps->i1_sps_id == sps_id))
            ps_pps->i1_pps_valid = 0;
    }
}